

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder *
capnp::_::WireHelpers::getWritableListPointerAnySize
          (ListBuilder *__return_storage_ptr__,WirePointer *origRef,word *origRefTarget,
          SegmentBuilder *origSegment,CapTableBuilder *capTable,word *defaultValue,
          BuilderArena *orphanArena)

{
  undefined8 ptr_00;
  word *pwVar1;
  word *pwVar2;
  bool bVar3;
  ElementSize size;
  unsigned_short uVar4;
  unsigned_short structPointerCount;
  WordCountN<17> WVar5;
  ListElementCount size_00;
  BitsPerElementTableType structDataSize;
  PointersPerElementN<1> PVar6;
  ElementCountN<29> size_01;
  void *ptr_01;
  uint step;
  uint pointerCount;
  uint dataSize;
  Fault f_1;
  Kind local_c0;
  DebugExpression<capnp::_::WirePointer::Kind> local_bc;
  undefined1 local_b8 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_1;
  WirePointer *tag;
  ElementSize elementSize;
  Fault local_80;
  Fault f;
  Kind local_70;
  DebugExpression<capnp::_::WirePointer::Kind> local_6c;
  undefined1 local_68 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  word *ptr;
  SegmentBuilder *segment;
  WirePointer *ref;
  word *defaultValue_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *origSegment_local;
  word *origRefTarget_local;
  WirePointer *origRef_local;
  
  ref = (WirePointer *)defaultValue;
  defaultValue_local = (word *)capTable;
  capTable_local = (CapTableBuilder *)origSegment;
  origSegment_local = (SegmentBuilder *)origRefTarget;
  origRefTarget_local = (word *)origRef;
  bVar3 = WirePointer::isNull(origRef);
  if (bVar3) goto LAB_0028f622;
  while( true ) {
    segment = (SegmentBuilder *)origRefTarget_local;
    ptr = (word *)capTable_local;
    _kjCondition._24_8_ =
         followFars((WirePointer **)&segment,(word *)origSegment_local,(SegmentBuilder **)&ptr);
    local_70 = WirePointer::kind((WirePointer *)segment);
    local_6c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
    f.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_68
               ,&local_6c,(Kind *)((long)&f.exception + 4));
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
    if (bVar3) {
      size = WirePointer::ListRef::elementSize
                       ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
      if (size == INLINE_COMPOSITE) {
        _kjCondition_1.result = _kjCondition.result;
        _kjCondition_1._25_7_ = _kjCondition._25_7_;
        local_c0 = WirePointer::kind((WirePointer *)_kjCondition._24_8_);
        local_bc = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c0);
        f_1.exception._4_4_ = 0;
        kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                  ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                   local_b8,&local_bc,(Kind *)((long)&f_1.exception + 4));
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
        pwVar2 = defaultValue_local;
        pwVar1 = ptr;
        if (!bVar3) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    ((Fault *)&pointerCount,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x58c,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      local_b8,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal((Fault *)&pointerCount);
        }
        ptr_01 = (void *)(_kjCondition._24_8_ + 8);
        _kjCondition._24_8_ = ptr_01;
        WVar5 = WirePointer::StructRef::wordSize((StructRef *)(_kjCondition_1._24_8_ + 4));
        size_00 = WirePointer::inlineCompositeListElementCount((WirePointer *)_kjCondition_1._24_8_)
        ;
        uVar4 = DirectWireValue<unsigned_short>::get
                          ((DirectWireValue<unsigned_short> *)(_kjCondition_1._24_8_ + 4));
        structPointerCount =
             DirectWireValue<unsigned_short>::get
                       ((DirectWireValue<unsigned_short> *)(_kjCondition_1._24_8_ + 6));
        ListBuilder::ListBuilder
                  (__return_storage_ptr__,(SegmentBuilder *)pwVar1,(CapTableBuilder *)pwVar2,ptr_01,
                   WVar5 << 6,size_00,(uint)uVar4 << 6,structPointerCount,INLINE_COMPOSITE);
      }
      else {
        structDataSize = dataBitsPerElement(size);
        PVar6 = pointersPerElement(size);
        pwVar2 = defaultValue_local;
        pwVar1 = ptr;
        ptr_00 = _kjCondition._24_8_;
        size_01 = WirePointer::ListRef::elementCount
                            ((ListRef *)((long)&(segment->super_SegmentReader).arena + 4));
        ListBuilder::ListBuilder
                  (__return_storage_ptr__,(SegmentBuilder *)pwVar1,(CapTableBuilder *)pwVar2,
                   (void *)ptr_00,structDataSize + PVar6 * 0x40,size_01,structDataSize,
                   (StructPointerCount)PVar6,size);
      }
      return __return_storage_ptr__;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[92]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x582,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a \" \"list.\""
               ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                local_68,
               (char (*) [92])
               "Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a list."
              );
    kj::_::Debug::Fault::~Fault(&local_80);
LAB_0028f622:
    if ((ref == (WirePointer *)0x0) || (bVar3 = WirePointer::isNull(ref), bVar3)) break;
    origSegment_local =
         (SegmentBuilder *)
         copyMessage((SegmentBuilder **)&capTable_local,(CapTableBuilder *)defaultValue_local,
                     (WirePointer **)&origRefTarget_local,ref);
    ref = (WirePointer *)0x0;
  }
  ListBuilder::ListBuilder(__return_storage_ptr__,VOID);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(ListBuilder getWritableListPointerAnySize(
      WirePointer* origRef, word* origRefTarget,
      SegmentBuilder* origSegment, CapTableBuilder* capTable,
      const word* defaultValue, BuilderArena* orphanArena = nullptr)) {
    if (origRef->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return ListBuilder(ElementSize::VOID);
      }
      origRefTarget = copyMessage(
          origSegment, capTable, origRef, reinterpret_cast<const WirePointer*>(defaultValue));
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    WirePointer* ref = origRef;
    SegmentBuilder* segment = origSegment;
    word* ptr = followFars(ref, origRefTarget, segment);

    KJ_REQUIRE(ref->kind() == WirePointer::LIST,
        "Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a "
        "list.") {
      goto useDefault;
    }

    ElementSize elementSize = ref->listRef.elementSize();

    if (elementSize == ElementSize::INLINE_COMPOSITE) {
      // Read the tag to get the actual element count.
      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
          "INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      ptr += POINTER_SIZE_IN_WORDS;

      return ListBuilder(segment, capTable, ptr,
                         tag->structRef.wordSize() * BITS_PER_WORD / ELEMENTS,
                         tag->inlineCompositeListElementCount(),
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE);
    } else {
      auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
      auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;

      auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
      return ListBuilder(segment, capTable, ptr, step, ref->listRef.elementCount(),
                         dataSize, pointerCount, elementSize);
    }
  }